

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O1

void __thiscall helics::apps::Echo::Echo(Echo *this,string_view name,string *jsonString)

{
  element_type *peVar1;
  
  apps::App::App(&this->super_App,name,jsonString);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Echo_00522a58;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_M_initialize_map
            (&(this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>,0);
  *(undefined8 *)((long)&(this->delayTimeLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTimeLock).super___mutex_base._M_mutex + 8) = 0;
  (this->delayTime).internalTimeCode = 0;
  this->echoCounter = 0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  processArgs(this);
  if ((this->super_App).deactivated == false) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ValueFederate)._vptr_ValueFederate[2])(peVar1,0x51,1);
    apps::App::loadInputFiles(&this->super_App);
  }
  return;
}

Assistant:

Echo::Echo(std::string_view name, const std::string& jsonString): App(name, jsonString)
    {
        processArgs();
        initialSetup();
    }